

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall
QToolBarAreaLayout::getStyleOptionInfo
          (QToolBarAreaLayout *this,QStyleOptionToolBar *option,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  long lVar2;
  QToolBar *pQVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  lVar4 = 0;
  do {
    uVar5 = this->docks[lVar4].lines.d.size;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pQVar1 = this->docks[lVar4].lines.d.ptr;
        if (pQVar1[uVar6].toolBarItems.d.size != 0) {
          lVar7 = 0;
          uVar5 = 0;
          do {
            pQVar3 = (QToolBar *)
                     (**(code **)(**(long **)((long)&(pQVar1[uVar6].toolBarItems.d.ptr)->widgetItem
                                             + lVar7) + 0x68))();
            if (pQVar3 == toolBar) {
              lVar2 = pQVar1[uVar6].toolBarItems.d.size;
              if (lVar2 == 1) {
                option->positionWithinLine = OnlyOne;
              }
              else if (lVar7 == 0) {
                option->positionWithinLine = Beginning;
              }
              else if (lVar2 - 1U == uVar5) {
                option->positionWithinLine = End;
              }
              else {
                option->positionWithinLine = Middle;
              }
              lVar4 = this->docks[lVar4].lines.d.size;
              if (lVar4 == 1) {
                option->positionOfLine = OnlyOne;
                return;
              }
              if (uVar6 == 0) {
                option->positionOfLine = Beginning;
                return;
              }
              if (lVar4 - 1U == uVar6) {
                option->positionOfLine = End;
                return;
              }
              option->positionOfLine = Middle;
              return;
            }
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + 0x18;
          } while (uVar5 < (ulong)pQVar1[uVar6].toolBarItems.d.size);
          uVar5 = this->docks[lVar4].lines.d.size;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void QToolBarAreaLayout::getStyleOptionInfo(QStyleOptionToolBar *option, QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar) {
                    if (line.toolBarItems.size() == 1)
                        option->positionWithinLine = QStyleOptionToolBar::OnlyOne;
                    else if (k == 0)
                        option->positionWithinLine = QStyleOptionToolBar::Beginning;
                    else if (k == line.toolBarItems.size() - 1)
                        option->positionWithinLine = QStyleOptionToolBar::End;
                    else
                        option->positionWithinLine = QStyleOptionToolBar::Middle;

                    if (dock.lines.size() == 1)
                        option->positionOfLine = QStyleOptionToolBar::OnlyOne;
                    else if (j == 0)
                        option->positionOfLine = QStyleOptionToolBar::Beginning;
                    else if (j == dock.lines.size() - 1)
                        option->positionOfLine = QStyleOptionToolBar::End;
                    else
                        option->positionOfLine = QStyleOptionToolBar::Middle;

                    return;
                }
            }
        }
    }
}